

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

char * oonf_layer2_data_to_string
                 (char *buffer,size_t length,oonf_layer2_data *data,oonf_layer2_metadata *meta,
                 _Bool raw)

{
  char *pcVar1;
  isonumber_str iso_str;
  isonumber_str local_40;
  
  if (meta->type == OONF_LAYER2_BOOLEAN_DATA) {
    pcVar1 = "false";
    if ((data->_value).boolean != false) {
      pcVar1 = "true";
    }
    pcVar1 = strscpy(buffer,pcVar1,length);
    return pcVar1;
  }
  if ((meta->type == OONF_LAYER2_INTEGER_DATA) &&
     (pcVar1 = isonumber_from_s64(&local_40,(data->_value).integer,meta->unit,meta->scaling,raw),
     pcVar1 != (char *)0x0)) {
    pcVar1 = strscpy(buffer,local_40.buf,length);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

const char *
oonf_layer2_data_to_string(
  char *buffer, size_t length, const struct oonf_layer2_data *data, const struct oonf_layer2_metadata *meta, bool raw) {
  struct isonumber_str iso_str;

  switch (meta->type) {
    case OONF_LAYER2_INTEGER_DATA:
      if (!isonumber_from_s64(&iso_str, data->_value.integer, meta->unit, meta->scaling, raw)) {
        return NULL;
      }
      return strscpy(buffer, iso_str.buf, length);

    case OONF_LAYER2_BOOLEAN_DATA:
      return strscpy(buffer, json_getbool(data->_value.boolean), length);

    default:
      return NULL;
  }
}